

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3aTextureMipmapTests.cpp
# Opt level: O3

int __thiscall
deqp::gles3::Accuracy::TextureMipmapTests::init(TextureMipmapTests *this,EVP_PKEY_CTX *ctx)

{
  deUint32 wrapS;
  char *pcVar1;
  TestContext *testCtx;
  Context *pCVar2;
  RenderContext *renderCtx;
  ContextInfo *renderCtxInfo;
  anon_struct_16_2_3f8b7511 *paVar3;
  undefined4 uVar4;
  TestNode *pTVar5;
  size_t sVar6;
  Texture2DMipmapCase *this_00;
  long lVar7;
  TextureCubeMipmapCase *this_01;
  long lVar8;
  TextureMipmapTests *pTVar9;
  TestNode *local_208;
  anon_struct_16_2_3f8b7511 *local_200;
  TextureMipmapTests *local_1f8;
  TestNode *local_1f0;
  long local_1e8;
  long local_1e0;
  TestNode *local_1d8;
  anon_struct_24_3_7bec94c7 *local_1d0;
  long *local_1c8;
  long local_1b8 [2];
  ostringstream name;
  ios_base local_138 [264];
  
  local_208 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_208,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"2d",
             "2D Texture Mipmapping");
  pTVar5 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"cube",
             "Cube Map Filtering");
  tcu::TestNode::addChild((TestNode *)this,local_208);
  local_1f0 = pTVar5;
  tcu::TestNode::addChild((TestNode *)this,pTVar5);
  lVar7 = 0;
  local_1f8 = this;
  do {
    pTVar9 = local_1f8;
    pTVar5 = (TestNode *)operator_new(0x70);
    local_1e8 = lVar7;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar5,
               (pTVar9->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
               init::coordTypes[lVar7].name,init::coordTypes[lVar7].desc);
    local_1d0 = init::coordTypes + lVar7;
    local_1d8 = pTVar5;
    tcu::TestNode::addChild(local_208,pTVar5);
    lVar7 = 0;
    do {
      local_200 = init::minFilterModes + lVar7;
      lVar8 = 8;
      local_1e0 = lVar7;
      do {
        paVar3 = local_200;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&name);
        pcVar1 = paVar3->name;
        if (pcVar1 == (char *)0x0) {
          std::ios::clear((int)&local_208 + (int)*(undefined8 *)(_name + -0x18) + 0x60);
        }
        else {
          sVar6 = strlen(pcVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&name,pcVar1,sVar6);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&name,"_",1);
        pcVar1 = *(char **)(&UNK_00cf5238 + lVar8);
        if (pcVar1 == (char *)0x0) {
          std::ios::clear((int)&local_208 + (int)*(undefined8 *)(_name + -0x18) + 0x60);
        }
        else {
          sVar6 = strlen(pcVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&name,pcVar1,sVar6);
        }
        this_00 = (Texture2DMipmapCase *)operator_new(0x100);
        testCtx = (pTVar9->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
        pCVar2 = (pTVar9->super_TestCaseGroup).m_context;
        renderCtx = pCVar2->m_renderCtx;
        renderCtxInfo = pCVar2->m_contextInfo;
        std::__cxx11::stringbuf::str();
        wrapS = *(deUint32 *)((long)&init::wrapModes[0].name + lVar8);
        Texture2DMipmapCase::Texture2DMipmapCase
                  (this_00,testCtx,renderCtx,renderCtxInfo,(char *)local_1c8,"",local_1d0->type,
                   paVar3->mode,wrapS,wrapS,0x1908,0x1401,0x40,0x40);
        tcu::TestNode::addChild(local_1d8,(TestNode *)this_00);
        if (local_1c8 != local_1b8) {
          operator_delete(local_1c8,local_1b8[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name);
        std::ios_base::~ios_base(local_138);
        lVar8 = lVar8 + 0x10;
        pTVar9 = local_1f8;
      } while (lVar8 != 0x38);
      lVar7 = local_1e0 + 1;
    } while (lVar7 != 4);
    lVar7 = local_1e8 + 1;
  } while (lVar7 != 3);
  uVar4 = 1;
  lVar7 = 0;
  do {
    pTVar9 = local_1f8;
    local_200 = (anon_struct_16_2_3f8b7511 *)CONCAT44(local_200._4_4_,uVar4);
    pTVar5 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar5,
               (pTVar9->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
               init::cubeCoordTypes[lVar7].name,init::cubeCoordTypes[lVar7].desc);
    tcu::TestNode::addChild(local_1f0,pTVar5);
    lVar8 = 0;
    do {
      this_01 = (TextureCubeMipmapCase *)operator_new(0x100);
      pCVar2 = (local_1f8->super_TestCaseGroup).m_context;
      TextureCubeMipmapCase::TextureCubeMipmapCase
                (this_01,(local_1f8->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.
                         m_testCtx,pCVar2->m_renderCtx,pCVar2->m_contextInfo,
                 *(char **)((long)&init::minFilterModes[0].name + lVar8),"",
                 init::cubeCoordTypes[lVar7].type,
                 *(deUint32 *)((long)&init::minFilterModes[0].mode + lVar8),0x812f,0x812f,0x1908,
                 0x1401,0x40);
      tcu::TestNode::addChild(pTVar5,(TestNode *)this_01);
      lVar8 = lVar8 + 0x10;
    } while (lVar8 != 0x40);
    lVar7 = 1;
    uVar4 = 0;
  } while (((ulong)local_200 & 1) != 0);
  return 0;
}

Assistant:

void TextureMipmapTests::init (void)
{
	tcu::TestCaseGroup* group2D		= new tcu::TestCaseGroup(m_testCtx, "2d",	"2D Texture Mipmapping");
	tcu::TestCaseGroup*	groupCube	= new tcu::TestCaseGroup(m_testCtx, "cube",	"Cube Map Filtering");
	addChild(group2D);
	addChild(groupCube);

	static const struct
	{
		const char*		name;
		deUint32		mode;
	} wrapModes[] =
	{
		{ "clamp",		GL_CLAMP_TO_EDGE },
		{ "repeat",		GL_REPEAT },
		{ "mirror",		GL_MIRRORED_REPEAT }
	};

	static const struct
	{
		const char*		name;
		deUint32		mode;
	} minFilterModes[] =
	{
		{ "nearest_nearest",	GL_NEAREST_MIPMAP_NEAREST	},
		{ "linear_nearest",		GL_LINEAR_MIPMAP_NEAREST	},
		{ "nearest_linear",		GL_NEAREST_MIPMAP_LINEAR	},
		{ "linear_linear",		GL_LINEAR_MIPMAP_LINEAR		}
	};

	static const struct
	{
		CoordType		type;
		const char*		name;
		const char*		desc;
	} coordTypes[] =
	{
		{ COORDTYPE_BASIC,		"basic",		"Mipmapping with translated and scaled coordinates" },
		{ COORDTYPE_AFFINE,		"affine",		"Mipmapping with affine coordinate transform"		},
		{ COORDTYPE_PROJECTED,	"projected",	"Mipmapping with perspective projection"			}
	};

	const int tex2DWidth	= 64;
	const int tex2DHeight	= 64;

	// 2D cases.
	for (int coordType = 0; coordType < DE_LENGTH_OF_ARRAY(coordTypes); coordType++)
	{
		tcu::TestCaseGroup* coordTypeGroup = new tcu::TestCaseGroup(m_testCtx, coordTypes[coordType].name, coordTypes[coordType].desc);
		group2D->addChild(coordTypeGroup);

		for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
		{
			for (int wrapMode = 0; wrapMode < DE_LENGTH_OF_ARRAY(wrapModes); wrapMode++)
			{
				std::ostringstream name;
				name << minFilterModes[minFilter].name
						<< "_" << wrapModes[wrapMode].name;

				coordTypeGroup->addChild(new Texture2DMipmapCase(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(),
																	name.str().c_str(), "",
																	coordTypes[coordType].type,
																	minFilterModes[minFilter].mode,
																	wrapModes[wrapMode].mode,
																	wrapModes[wrapMode].mode,
																	GL_RGBA, GL_UNSIGNED_BYTE,
																	tex2DWidth, tex2DHeight));
			}
		}
	}

	const int cubeMapSize = 64;

	static const struct
	{
		CoordType		type;
		const char*		name;
		const char*		desc;
	} cubeCoordTypes[] =
	{
		{ COORDTYPE_BASIC,		"basic",		"Mipmapping with translated and scaled coordinates" },
		{ COORDTYPE_PROJECTED,	"projected",	"Mipmapping with perspective projection"			}
	};

	// Cubemap cases.
	for (int coordType = 0; coordType < DE_LENGTH_OF_ARRAY(cubeCoordTypes); coordType++)
	{
		tcu::TestCaseGroup* coordTypeGroup = new tcu::TestCaseGroup(m_testCtx, cubeCoordTypes[coordType].name, cubeCoordTypes[coordType].desc);
		groupCube->addChild(coordTypeGroup);

		for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
		{
			coordTypeGroup->addChild(new TextureCubeMipmapCase(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(),
															   minFilterModes[minFilter].name, "",
															   cubeCoordTypes[coordType].type,
															   minFilterModes[minFilter].mode,
															   GL_CLAMP_TO_EDGE,
															   GL_CLAMP_TO_EDGE,
															   GL_RGBA, GL_UNSIGNED_BYTE, cubeMapSize));
		}
	}
}